

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::ChainImpl::broadcastTransaction
          (ChainImpl *this,CTransactionRef *tx,CAmount *max_tx_fee,bool relay,string *err_string)

{
  _Atomic_word *p_Var1;
  NodeContext *node;
  TransactionError TVar2;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  bool in_stack_ffffffffffffffd8;
  element_type *local_20;
  pointer local_18;
  pointer local_10;
  
  local_10 = *(pointer *)(in_FS_OFFSET + 0x28);
  node = this->m_node;
  local_20 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18 = (pointer)(tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
  if (local_18 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)(local_18->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)(local_18->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err_string;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffe0;
  TVar2 = BroadcastTransaction
                    (node,tx_00,(string *)max_tx_fee,(CAmount *)(ulong)relay,false,
                     in_stack_ffffffffffffffd8);
  if (local_18 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_10) {
    return TVar2 == OK;
  }
  __stack_chk_fail();
}

Assistant:

bool broadcastTransaction(const CTransactionRef& tx,
        const CAmount& max_tx_fee,
        bool relay,
        std::string& err_string) override
    {
        const TransactionError err = BroadcastTransaction(m_node, tx, err_string, max_tx_fee, relay, /*wait_callback=*/false);
        // Chain clients only care about failures to accept the tx to the mempool. Disregard non-mempool related failures.
        // Note: this will need to be updated if BroadcastTransactions() is updated to return other non-mempool failures
        // that Chain clients do not need to know about.
        return TransactionError::OK == err;
    }